

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

string * __thiscall
cmsys::Encoding::ToNarrow_abi_cxx11_(string *__return_storage_ptr__,Encoding *this,wchar_t *wcstr)

{
  size_t sVar1;
  size_type __n;
  reference pvVar2;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> chars;
  size_t length;
  wchar_t *wcstr_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = cmsysEncoding_wcstombs((char *)0x0,(wchar_t *)this,0);
  __n = sVar1 + 1;
  if (__n != 0) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_50,__n,&local_51);
    std::allocator<char>::~allocator(&local_51);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_50,0);
    sVar1 = cmsysEncoding_wcstombs(pvVar2,(wchar_t *)this,__n);
    if (sVar1 != 0) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_50,0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pvVar2);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Encoding::ToNarrow(const wchar_t* wcstr)
{
  std::string str;
  size_t length = kwsysEncoding_wcstombs(KWSYS_NULLPTR, wcstr, 0) + 1;
  if (length > 0) {
    std::vector<char> chars(length);
    if (kwsysEncoding_wcstombs(&chars[0], wcstr, length) > 0) {
      str = &chars[0];
    }
  }
  return str;
}